

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Bytes __thiscall Omega_h::bit_or_each(Omega_h *this,Bytes *a,Bytes *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  void *extraout_RDX;
  LO size_in;
  uint uVar6;
  Bytes BVar7;
  Write<signed_char> c;
  type f;
  Write<signed_char> local_e0;
  Write<signed_char> local_d0;
  string local_c0;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)pAVar1->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 3);
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar5 = (int)pAVar2->size;
  }
  else {
    iVar5 = (int)((ulong)pAVar2 >> 3);
  }
  if (iVar3 == iVar5) {
    if (((ulong)pAVar1 & 1) == 0) {
      size_in = (LO)pAVar1->size;
    }
    else {
      size_in = (LO)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::string::string((string *)&local_c0,"",(allocator *)&local_90);
    Write<signed_char>::Write(&local_e0,size_in,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    Write<signed_char>::Write(&local_60,&local_e0);
    Write<signed_char>::Write(&local_50,&a->write_);
    Write<signed_char>::Write(&local_40,&b->write_);
    if (((ulong)local_e0.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (uint)(local_e0.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (uint)((ulong)local_e0.shared_alloc_.alloc >> 3);
    }
    Write<signed_char>::Write(&local_90,&local_60);
    Write<signed_char>::Write(&local_80,&local_50);
    Write<signed_char>::Write(&local_70,&local_40);
    if (0 < (int)uVar6) {
      entering_parallel = 1;
      Write<signed_char>::Write((Write<signed_char> *)&local_c0,&local_90);
      Write<signed_char>::Write((Write<signed_char> *)&local_c0.field_2,&local_80);
      Write<signed_char>::Write(&local_a0,&local_70);
      entering_parallel = 0;
      for (uVar4 = 0; (uVar6 & 0x7fffffff) != uVar4; uVar4 = uVar4 + 1) {
        *(byte *)(local_c0._M_string_length + uVar4) =
             *(byte *)((long)local_a0.shared_alloc_.direct_ptr + uVar4) |
             *(byte *)(local_c0.field_2._8_8_ + uVar4);
      }
      bit_or_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0
                ((__0 *)&local_c0);
    }
    bit_or_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_90);
    Write<signed_char>::Write(&local_d0,&local_e0);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_d0);
    Write<signed_char>::~Write(&local_d0);
    bit_or_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_60);
    Write<signed_char>::~Write(&local_e0);
    BVar7.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x171);
}

Assistant:

Bytes bit_or_each(Bytes a, Bytes b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] | b[i]); };
  parallel_for(c.size(), f, "bit_or_each");
  return c;
}